

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

void __thiscall
xmrig::CudaBackendPrivate::CudaBackendPrivate(CudaBackendPrivate *this,Controller *controller)

{
  Config *this_00;
  CudaConfig *ctx;
  
  this->controller = controller;
  (this->status).m_errors = 0;
  (this->status).m_started = 0;
  (this->status).m_threads = 0;
  (this->status).m_ts = 0;
  (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threads).super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads).super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->driverVersion = 0;
  this->runtimeVersion = 0;
  Workers<xmrig::CudaLaunchData>::Workers(&this->workers);
  this_00 = Base::config(&controller->super_Base);
  ctx = Config::cuda(this_00);
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

inline CudaBackendPrivate(Controller *controller) :
        controller(controller)
    {
        init(controller->config()->cuda());
    }